

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_> * __thiscall
embree::XMLLoader::loadVec2iArray(XMLLoader *this,Ref<embree::XML> *xml)

{
  byte bVar1;
  int iVar2;
  size_type sVar3;
  runtime_error *this_00;
  long *in_RDX;
  vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_> *in_RDI;
  size_t i;
  Ref<embree::XML> *in_stack_000000d8;
  XMLLoader *in_stack_000000e0;
  vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_> *data;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  size_type in_stack_fffffffffffffe78;
  ulong uVar4;
  vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_> *this_01;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  XML *this_02;
  Token *this_03;
  int local_130;
  int local_12c;
  int local_128;
  int local_124;
  ulong local_120;
  undefined1 local_111;
  ParseLocation *in_stack_ffffffffffffff08;
  string local_f0 [35];
  undefined1 local_cd;
  undefined1 local_b9 [33];
  string local_98 [32];
  long *local_78;
  long *local_60;
  long *local_58;
  long *local_50;
  long *local_48;
  long *local_40;
  int *local_30;
  int *local_28;
  int *local_20;
  int *local_10;
  reference local_8;
  
  if (*in_RDX == 0) {
    memset(in_RDI,0,0x18);
    std::vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>::vector
              ((vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_> *)0x37adc2);
  }
  else {
    this_02 = (XML *)*in_RDX;
    this_03 = (Token *)local_b9;
    local_78 = in_RDX;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_b9 + 1),"ofs",(allocator *)this_03);
    XML::parm(this_02,(string *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
    bVar1 = std::operator!=(in_stack_fffffffffffffe60,
                            (char *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    std::__cxx11::string::~string(local_98);
    std::__cxx11::string::~string((string *)(local_b9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_b9);
    if ((bVar1 & 1) == 0) {
      local_cd = 0;
      std::vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>::vector
                ((vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_> *)0x37af18);
      local_40 = local_78;
      sVar3 = std::vector<embree::Token,_std::allocator<embree::Token>_>::size
                        ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_78 + 0x98)
                        );
      if ((sVar3 & 1) != 0) {
        local_111 = 1;
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_48 = local_78;
        ParseLocation::str_abi_cxx11_(in_stack_ffffffffffffff08);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                       (char *)in_stack_fffffffffffffe60);
        std::runtime_error::runtime_error(this_00,local_f0);
        local_111 = 0;
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_50 = local_78;
      this_01 = (vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_> *)*local_78;
      std::vector<embree::Token,_std::allocator<embree::Token>_>::size
                ((vector<embree::Token,_std::allocator<embree::Token>_> *)
                 &this_01[6].
                  super__Vector_base<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>._M_impl
                  .super__Vector_impl_data._M_finish);
      std::vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>::resize
                (this_01,in_stack_fffffffffffffe78);
      local_120 = 0;
      while (uVar4 = local_120,
            sVar3 = std::vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>::size
                              (in_RDI), uVar4 < sVar3) {
        local_58 = local_78;
        std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
                  ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_78 + 0x98),
                   local_120 * 2);
        local_12c = Token::Int(this_03);
        local_60 = local_78;
        std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
                  ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_78 + 0x98),
                   local_120 * 2 + 1);
        iVar2 = Token::Int(this_03);
        local_20 = &local_128;
        local_28 = &local_12c;
        local_30 = &local_130;
        local_128 = local_12c;
        local_124 = local_130;
        local_130 = iVar2;
        local_8 = std::vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>::operator[]
                            (in_RDI,local_120);
        local_10 = &local_128;
        (local_8->field_0).field_0.x = local_128;
        (local_8->field_0).field_0.y = local_124;
        local_120 = local_120 + 1;
      }
    }
    else {
      loadBinary<std::vector<embree::Vec2<int>,std::allocator<embree::Vec2<int>>>>
                (in_stack_000000e0,in_stack_000000d8);
    }
  }
  return in_RDI;
}

Assistant:

std::vector<Vec2i> XMLLoader::loadVec2iArray(const Ref<XML>& xml)
  {
    if (!xml) return std::vector<Vec2i>();

    if (xml->parm("ofs") != "") {
      return loadBinary<std::vector<Vec2i>>(xml);
    } 
    else 
    {
      std::vector<Vec2i> data;
      if (xml->body.size() % 2 != 0) THROW_RUNTIME_ERROR(xml->loc.str()+": wrong vector<int2> body");
      data.resize(xml->body.size()/2);
      for (size_t i=0; i<data.size(); i++) 
        data[i] = Vec2i(xml->body[2*i+0].Int(),xml->body[2*i+1].Int());
      return data;
    }
  }